

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O3

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *pVVar1;
  double dVar2;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  DenseIndex DVar4;
  double *pdVar5;
  double dVar6;
  DenseIndex DVar7;
  ostream *poVar8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  long lVar10;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar11;
  char *__function;
  float fVar12;
  float fVar13;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_128;
  double local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  double local_e8;
  double local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (this->is_initialized_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EKF: ",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_128,4,4,1);
    pVVar1 = &(this->ekf_).x_;
    pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)local_128.m_xpr;
    DVar4 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_128.m_row;
    local_128.m_xpr = pMVar3;
    local_128.m_row = DVar4;
    free(pMVar3);
    local_128.m_row = 0;
    local_128.m_col = 1;
    local_128.m_currentBlockRows = 1;
    *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = 1.0;
    local_f0 = 1.0;
    local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,
                         &local_f0);
    local_f8 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar11,&local_f8);
    local_100 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar11,&local_100);
    if ((local_128.m_currentBlockRows + local_128.m_row !=
         ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows) || (local_128.m_col != 1)) {
LAB_00104adf:
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104ab6;
    }
    local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_128.m_row = 0;
    local_128.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,0x10,4,4);
    pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_128.m_xpr;
    DVar4 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    DVar7 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_128.m_row;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_128.m_col;
    local_128.m_xpr = pMVar3;
    local_128.m_row = DVar4;
    local_128.m_col = DVar7;
    free(pMVar3);
    local_128.m_row = 0;
    local_128.m_col = 1;
    local_128.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_f0 = 0.0;
    local_128.m_xpr = &(this->ekf_).F_;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_128,&local_f0);
    local_f8 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_f8);
    local_100 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_100);
    local_c0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_c0);
    local_c8 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_c8);
    local_d0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_d0);
    local_d8 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_d8);
    local_a0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a0);
    local_a8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a8);
    local_b0 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_b0);
    local_b8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_b8);
    local_80 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_80);
    local_88 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_88);
    local_90 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_90);
    local_98 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_98);
    lVar10 = ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols;
    if (local_128.m_currentBlockRows + local_128.m_row !=
        ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar10 != 0) goto LAB_00104aa1;
      lVar10 = 0;
    }
    if (local_128.m_col == lVar10) {
      local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
      local_128.m_row = 0;
      local_128.m_col = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,0x10,4,4);
      pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
               (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_128.m_xpr;
      DVar4 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      DVar7 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_128.m_row;
      (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_128.m_col;
      local_128.m_xpr = pMVar3;
      local_128.m_row = DVar4;
      local_128.m_col = DVar7;
      free(pMVar3);
      local_128.m_row = 0;
      local_128.m_col = 1;
      local_128.m_currentBlockRows = 1;
      *(this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data = 1.0;
      local_f0 = 0.0;
      local_128.m_xpr = &(this->ekf_).P_;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_128,&local_f0);
      local_f8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_f8);
      local_100 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_100);
      local_c0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_c0);
      local_c8 = 1.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_c8);
      local_d0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_d0);
      local_d8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_d8);
      local_a0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_a0);
      local_a8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_a8);
      local_b0 = 1000.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_b0);
      local_b8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_b8);
      local_80 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_80);
      local_88 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_88);
      local_90 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_90);
      local_98 = 1000.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar9,&local_98);
      lVar10 = ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
               .m_storage.m_cols;
      if (local_128.m_currentBlockRows + local_128.m_row !=
          ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) {
        if (lVar10 != 0) goto LAB_00104aa1;
        lVar10 = 0;
      }
      if (local_128.m_col == lVar10) {
        local_128.m_xpr = &this->H_laser_;
        local_128.m_row = 0;
        local_128.m_col = 1;
        local_128.m_currentBlockRows = 1;
        *(this->H_laser_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data = 1.0;
        local_f0 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (&local_128,&local_f0);
        local_f8 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar9,&local_f8);
        local_100 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar9,&local_100);
        local_c0 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar9,&local_c0);
        local_c8 = 1.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar9,&local_c8);
        local_d0 = 0.0;
        pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar9,&local_d0);
        local_d8 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                  (pCVar9,&local_d8);
        lVar10 = ((local_128.m_xpr)->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
        if (local_128.m_currentBlockRows + local_128.m_row !=
            ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) {
          if (lVar10 != 0) goto LAB_00104aa1;
          lVar10 = 0;
        }
        if (local_128.m_col == lVar10) {
          local_128.m_xpr = &this->Hj_;
          local_128.m_row = 0;
          local_128.m_col = 1;
          local_128.m_currentBlockRows = 1;
          *(this->Hj_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data = 1.0;
          local_f0 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (&local_128,&local_f0);
          local_f8 = 0.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_f8);
          local_100 = 0.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_100);
          local_c0 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_c0);
          local_c8 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_c8);
          local_d0 = 0.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_d0);
          local_d8 = 0.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_d8);
          local_a0 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_a0);
          local_a8 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_a8);
          local_b0 = 1.0;
          pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                             (pCVar9,&local_b0);
          local_b8 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                    (pCVar9,&local_b8);
          lVar10 = ((local_128.m_xpr)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_cols;
          if (local_128.m_currentBlockRows + local_128.m_row !=
              ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows) {
            if (lVar10 != 0) goto LAB_00104aa1;
            lVar10 = 0;
          }
          if (local_128.m_col == lVar10) {
            this->sigma_ax = 9.0;
            this->sigma_ay = 9.0;
            this->previous_timestamp_ = measurement_pack->timestamp_;
            if (measurement_pack->sensor_type_ == LASER) {
              lVar10 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if (lVar10 < 1) {
LAB_00104ac0:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x9c,
                              "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                             );
              }
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              fVar12 = (float)*pdVar5;
              this->px = fVar12;
              if (lVar10 == 1) goto LAB_00104ac0;
              fVar13 = (float)pdVar5[1];
              this->py = fVar13;
              if ((fVar12 == 0.0) && (!NAN(fVar12))) {
                return;
              }
              if ((fVar13 == 0.0) && (!NAN(fVar13))) {
                return;
              }
              local_128.m_row = 0;
              local_128.m_col = 1;
              local_128.m_currentBlockRows = 1;
              *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data = (double)fVar12;
              local_f0 = (Scalar)fVar13;
              local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
              pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   &local_128,&local_f0);
              local_f8 = 0.0;
              pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                  (pCVar11,&local_f8);
              local_100 = 0.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar11,&local_100);
LAB_00104a6c:
              if ((local_128.m_currentBlockRows + local_128.m_row ==
                   ((local_128.m_xpr)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows) && (local_128.m_col == 1)) {
LAB_00104a88:
                this->is_initialized_ = true;
                return;
              }
            }
            else {
              if (measurement_pack->sensor_type_ != RADAR) goto LAB_00104a88;
              lVar10 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if ((lVar10 < 1) || (lVar10 == 1)) goto LAB_00104ac0;
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              local_108 = *pdVar5;
              dVar6 = cos(pdVar5[1]);
              lVar10 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if ((lVar10 < 1) || (local_e0 = dVar6, lVar10 == 1)) goto LAB_00104ac0;
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              local_e8 = *pdVar5;
              local_58 = sin(pdVar5[1]);
              if ((measurement_pack->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                  3) goto LAB_00104ac0;
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              local_60 = pdVar5[2];
              local_68 = cos(pdVar5[1]);
              if ((measurement_pack->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                  3) goto LAB_00104ac0;
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              local_70 = pdVar5[2];
              dVar6 = sin(pdVar5[1]);
              lVar10 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if (lVar10 < 1) goto LAB_00104ac0;
              pdVar5 = (measurement_pack->raw_measurements_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              dVar2 = *pdVar5;
              if ((dVar2 != 0.0) || (NAN(dVar2))) {
                if (lVar10 == 1) goto LAB_00104ac0;
                dVar2 = pdVar5[1];
                if ((dVar2 != 0.0) || (NAN(dVar2))) {
                  local_128.m_row = 0;
                  local_128.m_col = 1;
                  local_128.m_currentBlockRows = 1;
                  *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data = (double)(float)(local_108 * local_e0);
                  local_f0 = (Scalar)(float)(local_e8 * local_58);
                  local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
                  local_78 = dVar6;
                  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                            operator_((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &local_128,&local_f0);
                  local_f8 = (Scalar)(float)(local_60 * local_68);
                  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                            operator_(pCVar11,&local_f8);
                  local_100 = (Scalar)(float)(local_70 * local_78);
                  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                            (pCVar11,&local_100);
                  goto LAB_00104a6c;
                }
              }
              local_128.m_row = 0;
              local_128.m_col = 1;
              local_128.m_currentBlockRows = 1;
              *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data = 0.0;
              local_f0 = 0.0;
              local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
              pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   &local_128,&local_f0);
              local_f8 = 0.0;
              pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                  (pCVar11,&local_f8);
              local_100 = 0.0;
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar11,&local_100);
              if ((local_128.m_currentBlockRows + local_128.m_row ==
                   ((local_128.m_xpr)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows) && (local_128.m_col == 1)) {
                return;
              }
            }
            goto LAB_00104adf;
          }
        }
      }
    }
  }
  else {
    fVar12 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0)
    ;
    this->previous_timestamp_ = measurement_pack->timestamp_;
    local_e0 = (double)CONCAT44(local_e0._4_4_,fVar12);
    local_108 = (double)fVar12;
    poVar8 = std::ostream::_M_insert<double>(local_108);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_128.m_xpr = &(this->ekf_).F_;
    local_128.m_row = 0;
    local_128.m_col = 1;
    local_128.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_f0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_128,&local_f0);
    local_f8 = local_108;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_f8);
    local_100 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_100);
    local_c0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_c0);
    local_c8 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_c8);
    local_d0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_d0);
    local_d8 = local_108;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_d8);
    local_a0 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a0);
    local_a8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a8);
    local_b0 = 1.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_b0);
    local_b8 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_b8);
    local_80 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_80);
    local_88 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_88);
    local_90 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_90);
    local_98 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_98);
    lVar10 = ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols;
    if (local_128.m_currentBlockRows + local_128.m_row !=
        ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar10 != 0) goto LAB_00104aa1;
      lVar10 = 0;
    }
    if (local_128.m_col == lVar10) {
      local_e8 = pow(local_108,3.0);
      local_108 = pow(local_108,4.0);
      local_128.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
      local_128.m_row = 0;
      local_128.m_col = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_128,0x10,4,4);
      pMVar3 = (Matrix<double,__1,__1,_0,__1,__1> *)
               (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_128.m_xpr;
      DVar4 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      DVar7 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_128.m_row;
      (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_128.m_col;
      local_128.m_xpr = pMVar3;
      local_128.m_row = DVar4;
      local_128.m_col = DVar7;
      local_108._0_4_ = (float)local_108;
      free(pMVar3);
      local_108._0_4_ = local_108._0_4_ * 0.25;
      local_128.m_row = 0;
      local_128.m_col = 1;
      local_128.m_currentBlockRows = 1;
      *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data = (double)(this->sigma_ax * local_108._0_4_);
      local_f0 = 0.0;
      local_128.m_xpr = &(this->ekf_).Q_;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (&local_128,&local_f0);
      fVar12 = (float)local_e8;
      local_e8 = (double)CONCAT44(local_e8._4_4_,fVar12 * 0.5);
      local_f8 = (Scalar)(this->sigma_ax * fVar12 * 0.5);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_f8);
      local_100 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_100);
      local_c0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_c0);
      local_c8 = (Scalar)(local_108._0_4_ * this->sigma_ay);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_c8);
      local_d0 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_d0);
      local_d8 = (Scalar)(this->sigma_ay * local_e8._0_4_);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_d8);
      local_a0 = (Scalar)(this->sigma_ax * local_e8._0_4_);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_a0);
      local_a8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_a8);
      fVar12 = local_e0._0_4_ * local_e0._0_4_;
      local_e0 = (double)CONCAT44(local_e0._4_4_,fVar12);
      local_b0 = (Scalar)(this->sigma_ax * fVar12);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_b0);
      local_b8 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_b8);
      local_80 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_80);
      local_88 = (Scalar)(local_e8._0_4_ * this->sigma_ay);
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_88);
      local_90 = 0.0;
      pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar9,&local_90);
      local_98 = (Scalar)(local_e0._0_4_ * this->sigma_ay);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar9,&local_98);
      lVar10 = ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
               .m_storage.m_cols;
      if (local_128.m_currentBlockRows + local_128.m_row !=
          ((local_128.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) {
        if (lVar10 != 0) goto LAB_00104aa1;
        lVar10 = 0;
      }
      if (local_128.m_col == lVar10) {
        this_00 = &this->ekf_;
        KalmanFilter::Predict(this_00);
        if (measurement_pack->sensor_type_ != RADAR) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
          KalmanFilter::Update(this_00,&measurement_pack->raw_measurements_);
          goto LAB_00104855;
        }
        Tools::CalculateJacobian((MatrixXd *)&local_128,&this->tools,&(this->ekf_).x_);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_50,&this->Hj_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_128);
        lVar10 = *(long *)(local_50 + 0x10);
        if (local_38 + local_48 != *(long *)(local_50 + 8)) {
          if (lVar10 != 0) goto LAB_00104aa1;
          lVar10 = 0;
        }
        if (local_40 == lVar10) {
          free(local_128.m_xpr);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Hj_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
          KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
LAB_00104855:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_ = ",5);
          poVar8 = Eigen::operator<<((ostream *)&std::cout,
                                     (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                     &(this->ekf_).x_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_ = ",5);
          poVar8 = Eigen::operator<<((ostream *)&std::cout,
                                     (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                     &(this->ekf_).P_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          return;
        }
      }
    }
  }
LAB_00104aa1:
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104ab6:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {
    /**
    TODO:
      * Initialize the state ekf_.x_ with the first measurement.
      * Create the covariance matrix.
      * Remember: you'll need to convert radar from polar to cartesian coordinates.
    */
    // first measurement
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // initial transition matrix F_
    ekf_.F_ = MatrixXd(4,4);
    ekf_.F_ << 1,0,1,0,
               0,1,0,1,
               0,0,1,0,
               0,0,0,1;

    // initial state covariance matrix P (error in the estimate/prediction)
    ekf_.P_ = MatrixXd (4,4);
    ekf_.P_ << 1,0,0,0,
               0,1,0,0,
               0,0,1000,0,
               0,0,0,1000;

      
    // Laser measurement matrix
    H_laser_ << 1,0,0,0,
                0,1,0,0;

    // Radar measurement matrix
    Hj_ << 1,1,0,0,
           1,1,0,0,
           1,1,1,1;

    // Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix 
    sigma_ax = 9;
    sigma_ay = 9;

    // initial timestamp 
    previous_timestamp_ = measurement_pack.timestamp_;

  

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
      Convert radar from polar to cartesian coordinates and initialize state.
      */
      float px = measurement_pack.raw_measurements_[0]*cos(measurement_pack.raw_measurements_[1]);
      //px = rho * cos(phi)
      float py = measurement_pack.raw_measurements_[0]*sin(measurement_pack.raw_measurements_[1]);
      //py = rho * sin(phi)
      float vx = measurement_pack.raw_measurements_[2]*cos(measurement_pack.raw_measurements_[1]);
      //vx = rho_dot * cos(phi)
      float vy = measurement_pack.raw_measurements_[2]*sin(measurement_pack.raw_measurements_[1]);
      //vy = rho_dot * sin(phi)


      if (measurement_pack.raw_measurements_[0] == 0 or measurement_pack.raw_measurements_[1] == 0){
        ekf_.x_<< 0, 0, 0, 0;
        return;
      }
      
      ekf_.x_ <<px, py, vx, vy;
       
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.
      */
      px = measurement_pack.raw_measurements_[0];
      py = measurement_pack.raw_measurements_[1];

      if (px == 0 or py == 0){
        return;
      }
      ekf_.x_<<px, py, 0, 0;
    }

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  /**
   TODO:
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use sigma_ax = 9 and sigma_ay = 9 for your Q matrix.
   */
  //dt - convert delta time to seconds
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0; 
  previous_timestamp_ = measurement_pack.timestamp_;
  cout << dt << endl;
  
  //update the transision Matrix F
  ekf_.F_ << 1, 0, dt, 0,
             0, 1, 0, dt,
             0, 0, 1, 0,
             0, 0, 0, 1;

  float dt_2 = pow(dt, 2);
  float dt_3 = pow(dt, 3);
  float dt_4 = pow(dt, 4);
  
  //set the process noise covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (dt_4/4)*sigma_ax, 0, (dt_3/2)*sigma_ax, 0,
              0, (dt_4/4)*sigma_ay, 0, (dt_3/2)*sigma_ay,
              (dt_3/2)*sigma_ax, 0, dt_2*sigma_ax, 0,
              0, (dt_3/2)*sigma_ay, 0, dt_2*sigma_ay;


  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
   TODO:
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates
    Hj_ << tools.CalculateJacobian(ekf_.x_);
    ekf_.H_ = Hj_;
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);  
  } 
  else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}